

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::STEP::EXPRESS::DataType> __thiscall
Assimp::STEP::EXPRESS::DataType::Parse
          (DataType *this,char **inout,uint64_t line,ConversionSchema *schema)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  SyntaxError *pSVar5;
  ulong uVar6;
  Logger *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sVar9;
  byte local_351;
  char *local_2d0;
  shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>_> local_268;
  uint64_t local_258;
  int64_t num;
  undefined1 local_248 [7];
  bool neg;
  double local_238;
  double f;
  char *start;
  string local_220;
  undefined1 local_200 [24];
  undefined1 local_1e8 [8];
  string stemp;
  string local_1c0;
  undefined1 local_19a;
  allocator<char> local_199;
  string local_198;
  char *local_178;
  char *start_2;
  shared_ptr<Assimp::STEP::EXPRESS::ENTITY> local_168;
  allocator local_151;
  string local_150 [32];
  undefined1 local_130 [24];
  string local_118;
  char *local_f8;
  char *start_1;
  shared_ptr<Assimp::STEP::EXPRESS::UNSET> local_e0;
  shared_ptr<Assimp::STEP::EXPRESS::ISDERIVED> local_d0;
  int local_c0;
  undefined1 local_b9;
  char *local_b8;
  char *local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  allocator local_91;
  undefined1 local_90 [8];
  string s;
  char *t;
  bool ok;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *cur;
  ConversionSchema *schema_local;
  uint64_t line_local;
  char **inout_local;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *dt;
  
  local_30 = *inout;
  cur = (char *)schema;
  schema_local = (ConversionSchema *)line;
  line_local = (uint64_t)inout;
  inout_local = (char **)this;
  SkipSpaces<char>(&local_30);
  if ((*local_30 == ',') || (bVar2 = IsSpaceOrNewLine<char>(*local_30), bVar2)) {
    pSVar5 = (SyntaxError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"unexpected token, expected parameter",&local_51);
    SyntaxError::SyntaxError(pSVar5,&local_50,(uint64_t)schema_local);
    __cxa_throw(pSVar5,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  if (cur != (char *)0x0) {
    bVar2 = false;
    s.field_2._8_8_ = local_30;
    while( true ) {
      bVar8 = false;
      if ((*(char *)s.field_2._8_8_ != '\0') && (bVar8 = false, *(char *)s.field_2._8_8_ != ')')) {
        bVar8 = *(char *)s.field_2._8_8_ != ',';
      }
      if (!bVar8) goto LAB_00b50563;
      if (*(char *)s.field_2._8_8_ == '(') break;
      bVar8 = IsSpace<char>(*(char *)s.field_2._8_8_);
      if (!bVar8) {
        bVar2 = true;
      }
      s.field_2._8_8_ = s.field_2._8_8_ + 1;
    }
    if (bVar2) {
      do {
        s.field_2._8_8_ = s.field_2._8_8_ + -1;
        bVar2 = IsSpace<char>(*(char *)s.field_2._8_8_);
        pcVar4 = local_30;
      } while (bVar2);
      lVar3 = s.field_2._8_8_ - (long)local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_90,pcVar4,lVar3 + 1,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_a0._M_current = (char *)std::__cxx11::string::begin();
      local_a8._M_current = (char *)std::__cxx11::string::end();
      local_b0 = (char *)std::__cxx11::string::begin();
      local_b8 = (char *)std::
                         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                                   (local_a0,local_a8,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_b0,ToLower<char>);
      bVar2 = ConversionSchema::IsKnownToken((ConversionSchema *)cur,(string *)local_90);
      if (bVar2) {
        local_30 = (char *)(s.field_2._8_8_ + 1);
        do {
          pcVar4 = local_30 + 1;
          cVar1 = *local_30;
          local_30 = pcVar4;
        } while (cVar1 != '(');
        local_b9 = 0;
        Parse(this,&local_30,0xffffffffffffffff,(ConversionSchema *)0x0);
        if (*local_30 == '\0') {
          local_2d0 = local_30;
        }
        else {
          local_2d0 = local_30 + 1;
        }
        *(char **)line_local = local_2d0;
        local_b9 = 1;
        local_c0 = 1;
      }
      else {
        local_c0 = 2;
      }
      std::__cxx11::string::~string((string *)local_90);
      _Var7._M_pi = extraout_RDX;
      if (local_c0 == 1) goto LAB_00b50f04;
    }
  }
LAB_00b50563:
  if (*local_30 == '*') {
    *(char **)line_local = local_30 + 1;
    std::make_shared<Assimp::STEP::EXPRESS::ISDERIVED>();
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::ISDERIVED,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,&local_d0);
    std::shared_ptr<Assimp::STEP::EXPRESS::ISDERIVED>::~shared_ptr(&local_d0);
    _Var7._M_pi = extraout_RDX_00;
  }
  else if (*local_30 == '$') {
    *(char **)line_local = local_30 + 1;
    std::make_shared<Assimp::STEP::EXPRESS::UNSET>();
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::UNSET,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,&local_e0);
    std::shared_ptr<Assimp::STEP::EXPRESS::UNSET>::~shared_ptr(&local_e0);
    _Var7._M_pi = extraout_RDX_01;
  }
  else if (*local_30 == '(') {
    *(char **)line_local = local_30;
    LIST::Parse((LIST *)&start_1,(char **)line_local,(uint64_t)schema_local,(ConversionSchema *)cur)
    ;
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::LIST_const,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,
               (shared_ptr<const_Assimp::STEP::EXPRESS::LIST> *)&start_1);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::LIST>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::LIST> *)&start_1);
    _Var7._M_pi = extraout_RDX_02;
  }
  else if (*local_30 == '.') {
    pcVar4 = local_30 + 1;
    for (local_30 = pcVar4; local_f8 = pcVar4, *local_30 != '.'; local_30 = local_30 + 1) {
      if (*local_30 == '\0') {
        local_130[0x16] = '\x01';
        pSVar5 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"enum not closed",(allocator<char> *)(local_130 + 0x17));
        SyntaxError::SyntaxError(pSVar5,&local_118,(uint64_t)schema_local);
        local_130[0x16] = '\0';
        __cxa_throw(pSVar5,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
    }
    *(char **)line_local = local_30 + 1;
    uVar6 = (long)local_30 - (long)pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,pcVar4,uVar6,&local_151);
    std::make_shared<Assimp::STEP::EXPRESS::ENUMERATION,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::ENUMERATION,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,
               (shared_ptr<Assimp::STEP::EXPRESS::ENUMERATION> *)local_130);
    std::shared_ptr<Assimp::STEP::EXPRESS::ENUMERATION>::~shared_ptr
              ((shared_ptr<Assimp::STEP::EXPRESS::ENUMERATION> *)local_130);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    _Var7._M_pi = extraout_RDX_03;
  }
  else if (*local_30 == '#') {
    local_30 = local_30 + 1;
    start_2 = (char *)strtoul10_64(local_30,(char **)line_local,(uint *)0x0);
    std::make_shared<Assimp::STEP::EXPRESS::ENTITY,unsigned_long>((unsigned_long *)&local_168);
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::ENTITY,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,&local_168);
    std::shared_ptr<Assimp::STEP::EXPRESS::ENTITY>::~shared_ptr(&local_168);
    _Var7._M_pi = extraout_RDX_04;
  }
  else if (*local_30 == '\'') {
    pcVar4 = local_30 + 1;
    for (local_30 = pcVar4; local_178 = pcVar4, *local_30 != '\''; local_30 = local_30 + 1) {
      if (*local_30 == '\0') {
        local_19a = 1;
        pSVar5 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"string literal not closed",&local_199);
        SyntaxError::SyntaxError(pSVar5,&local_198,(uint64_t)schema_local);
        local_19a = 0;
        __cxa_throw(pSVar5,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
    }
    cVar1 = local_30[1];
    while (cVar1 == '\'') {
      for (local_30 = local_30 + 2; *local_30 != '\''; local_30 = local_30 + 1) {
        if (*local_30 == '\0') {
          stemp.field_2._M_local_buf[0xe] = '\x01';
          pSVar5 = (SyntaxError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"string literal not closed",
                     (allocator<char> *)(stemp.field_2._M_local_buf + 0xf));
          SyntaxError::SyntaxError(pSVar5,&local_1c0,(uint64_t)schema_local);
          stemp.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(pSVar5,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
      }
      cVar1 = local_30[1];
    }
    *(char **)line_local = local_30 + 1;
    uVar6 = (long)local_30 - (long)pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1e8,pcVar4,uVar6,(allocator *)(local_200 + 0x17));
    std::allocator<char>::~allocator((allocator<char> *)(local_200 + 0x17));
    bVar2 = StringToUTF8((string *)local_1e8);
    if (!bVar2) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"an error occurred reading escape sequences in ASCII text");
    }
    std::
    make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,
               (shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_200);
    std::
    shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~shared_ptr((shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_200);
    local_c0 = 1;
    std::__cxx11::string::~string((string *)local_1e8);
    _Var7._M_pi = extraout_RDX_05;
  }
  else {
    if (*local_30 == '\"') {
      start._6_1_ = 1;
      pSVar5 = (SyntaxError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"binary data not supported yet",
                 (allocator<char> *)((long)&start + 7));
      SyntaxError::SyntaxError(pSVar5,&local_220,(uint64_t)schema_local);
      start._6_1_ = 0;
      __cxa_throw(pSVar5,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    f = (double)local_30;
    while( true ) {
      local_351 = 0;
      if (((*local_30 != '\0') && (local_351 = 0, *local_30 != ',')) &&
         (local_351 = 0, *local_30 != ')')) {
        bVar2 = IsSpace<char>(*local_30);
        local_351 = bVar2 ^ 0xff;
      }
      if ((local_351 & 1) == 0) {
        num._7_1_ = 0;
        if (*(char *)f == '-') {
          num._7_1_ = 1;
          f = (double)((long)f + 1);
        }
        else if (*(char *)f == '+') {
          f = (double)((long)f + 1);
        }
        local_258 = strtoul10_64((char *)f,(char **)line_local,(uint *)0x0);
        std::make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,long>((long *)&local_268);
        std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
        shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,void>
                  ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,&local_268);
        std::shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>_>::~shared_ptr(&local_268);
        _Var7._M_pi = extraout_RDX_07;
        goto LAB_00b50f04;
      }
      if (*local_30 == '.') break;
      local_30 = local_30 + 1;
    }
    pcVar4 = fast_atoreal_move<double>((char *)f,&local_238,true);
    *(char **)line_local = pcVar4;
    std::make_shared<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,double&>((double *)local_248);
    std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>::
    shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,void>
              ((shared_ptr<Assimp::STEP::EXPRESS::DataType_const> *)this,
               (shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>_> *)local_248);
    std::shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>_>::~shared_ptr
              ((shared_ptr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>_> *)local_248);
    _Var7._M_pi = extraout_RDX_06;
  }
LAB_00b50f04:
  sVar9.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  sVar9.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::DataType>)
         sVar9.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<const EXPRESS::DataType> EXPRESS::DataType::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/)
{
    const char* cur = inout;
    SkipSpaces(&cur);
    if (*cur == ',' || IsSpaceOrNewLine(*cur)) {
        throw STEP::SyntaxError("unexpected token, expected parameter",line);
    }

    // just skip over constructions such as IFCPLANEANGLEMEASURE(0.01) and read only the value
    if (schema) {
        bool ok = false;
        for(const char* t = cur; *t && *t != ')' && *t != ','; ++t) {
            if (*t=='(') {
                if (!ok) {
                    break;
                }
                for(--t;IsSpace(*t);--t);
                std::string s(cur,static_cast<size_t>(t-cur+1));
                std::transform(s.begin(),s.end(),s.begin(),&ToLower<char> );
                if (schema->IsKnownToken(s)) {
                    for(cur = t+1;*cur++ != '(';);
                    const std::shared_ptr<const EXPRESS::DataType> dt = Parse(cur);
                    inout = *cur ? cur+1 : cur;
                    return dt;
                }
                break;
            }
            else if (!IsSpace(*t)) {
                ok = true;
            }
        }
    }

    if (*cur == '*' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::ISDERIVED>();
    }
    else if (*cur == '$' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::UNSET>();
    }
    else if (*cur == '(' ) {
        // start of an aggregate, further parsing is done by the LIST factory constructor
        inout = cur;
        return EXPRESS::LIST::Parse(inout,line,schema);
    }
    else if (*cur == '.' ) {
        // enum (includes boolean)
        const char* start = ++cur;
        for(;*cur != '.';++cur) {
            if (*cur == '\0') {
                throw STEP::SyntaxError("enum not closed",line);
            }
        }
        inout = cur+1;
        return std::make_shared<EXPRESS::ENUMERATION>(std::string(start, static_cast<size_t>(cur-start) ));
    }
    else if (*cur == '#' ) {
        // object reference
        return std::make_shared<EXPRESS::ENTITY>(strtoul10_64(++cur,&inout));
    }
    else if (*cur == '\'' ) {
        // string literal
        const char* start = ++cur;

        for(;*cur != '\'';++cur)    {
            if (*cur == '\0')   {
                throw STEP::SyntaxError("string literal not closed",line);
            }
        }

        if (cur[1] == '\'') {
            // Vesanen: more than 2 escaped ' in one literal!
            do  {
                for(cur += 2;*cur != '\'';++cur)    {
                    if (*cur == '\0')   {
                        throw STEP::SyntaxError("string literal not closed",line);
                    }
                }
            }
            while(cur[1] == '\'');
        }

        inout = cur + 1;

        // assimp is supposed to output UTF8 strings, so we have to deal
        // with foreign encodings.
        std::string stemp = std::string(start, static_cast<size_t>(cur - start));
        if(!StringToUTF8(stemp)) {
            // TODO: route this to a correct logger with line numbers etc., better error messages
            ASSIMP_LOG_ERROR("an error occurred reading escape sequences in ASCII text");
        }

        return std::make_shared<EXPRESS::STRING>(stemp);
    }
    else if (*cur == '\"' ) {
        throw STEP::SyntaxError("binary data not supported yet",line);
    }

    // else -- must be a number. if there is a decimal dot in it,
    // parse it as real value, otherwise as integer.
    const char* start = cur;
    for(;*cur  && *cur != ',' && *cur != ')' && !IsSpace(*cur);++cur) {
        if (*cur == '.') {
            double f;
            inout = fast_atoreal_move<double>(start,f);
            return std::make_shared<EXPRESS::REAL>(f);
        }
    }

    bool neg = false;
    if (*start == '-') {
        neg = true;
        ++start;
    }
    else if (*start == '+') {
        ++start;
    }
    int64_t num = static_cast<int64_t>( strtoul10_64(start,&inout) );
    return std::make_shared<EXPRESS::INTEGER>(neg?-num:num);
}